

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O0

void __thiscall MxxImpl_CustomOp_Test::~MxxImpl_CustomOp_Test(MxxImpl_CustomOp_Test *this)

{
  MxxImpl_CustomOp_Test *this_local;
  
  ~MxxImpl_CustomOp_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(MxxImpl, CustomOp) {
    // test C++ functors (postive tests)
    {
        std::plus<int> x;
        mxx::custom_op<int> o(x);
        EXPECT_EQ(MPI_INT, o.get_type());
        EXPECT_EQ(MPI_SUM, o.get_op());
    }
    {
        std::multiplies<double> x;
        mxx::custom_op<double> o(x);
        EXPECT_EQ(MPI_DOUBLE, o.get_type());
        EXPECT_EQ(MPI_PROD, o.get_op());
    }
    {
        std::bit_or<char> x;
        mxx::custom_op<char> o(x);
        EXPECT_EQ(MPI_CHAR, o.get_type());
        EXPECT_EQ(MPI_BOR, o.get_op());
    }
    {
        std::bit_xor<long> x;
        mxx::custom_op<long> o(x);
        EXPECT_EQ(MPI_LONG, o.get_type());
        EXPECT_EQ(MPI_BXOR, o.get_op());
    }
    {
        std::bit_and<unsigned char> x;
        mxx::custom_op<unsigned char> o(x);
        EXPECT_EQ(MPI_UNSIGNED_CHAR, o.get_type());
        EXPECT_EQ(MPI_BAND, o.get_op());
    }
    {
        std::logical_or<unsigned int> x;
        mxx::custom_op<unsigned int> o(x);
        EXPECT_EQ(MPI_UNSIGNED, o.get_type());
        EXPECT_EQ(MPI_LOR, o.get_op());
    }
    {
        std::logical_and<unsigned short> x;
        mxx::custom_op<unsigned short> o(x);
        EXPECT_EQ(MPI_UNSIGNED_SHORT, o.get_type());
        EXPECT_EQ(MPI_LAND, o.get_op());
    }
    // test std::min and std::max
    {
        mxx::custom_op<float> o(static_cast<const float&(*)(const float&, const float&)>(&std::min<float>));
        EXPECT_EQ(MPI_FLOAT, o.get_type());
        EXPECT_EQ(MPI_MIN, o.get_op());
    }
    {
        mxx::custom_op<int> o(static_cast<const int&(*)(const int&, const int&)>(&std::max<int>));
        EXPECT_EQ(MPI_INT, o.get_type());
        EXPECT_EQ(MPI_MAX, o.get_op());
    }
    {
        mxx::max<int> x;
        mxx::custom_op<int> o(x);
        EXPECT_EQ(MPI_INT, o.get_type());
        EXPECT_EQ(MPI_MAX, o.get_op());
    }
    {
        mxx::min<int> x;
        mxx::custom_op<int> o(x);
        EXPECT_EQ(MPI_INT, o.get_type());
        EXPECT_EQ(MPI_MIN, o.get_op());
    }
}